

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O3

chunk_conflict * cave_new(wchar_t height,wchar_t width)

{
  chunk_conflict *pcVar1;
  int *piVar2;
  square **ppsVar3;
  uint16_t **ppuVar4;
  square *psVar5;
  void *pvVar6;
  uint16_t *puVar7;
  object **ppoVar8;
  monster *pmVar9;
  monster_group **ppmVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  pcVar1 = (chunk_conflict *)mem_zalloc(0x90);
  pcVar1->height = height;
  pcVar1->width = width;
  piVar2 = (int *)mem_zalloc(0x68);
  pcVar1->feat_count = piVar2;
  ppsVar3 = (square **)mem_zalloc((long)pcVar1->height << 3);
  pcVar1->squares = ppsVar3;
  ppuVar4 = (uint16_t **)mem_zalloc((long)pcVar1->height << 3);
  (pcVar1->noise).grids = ppuVar4;
  ppuVar4 = (uint16_t **)mem_zalloc((long)pcVar1->height << 3);
  (pcVar1->scent).grids = ppuVar4;
  if (0 < pcVar1->height) {
    lVar13 = 0;
    do {
      psVar5 = (square *)mem_zalloc((long)pcVar1->width * 0x28);
      pcVar1->squares[lVar13] = psVar5;
      lVar11 = (long)pcVar1->width;
      if (0 < lVar11) {
        lVar14 = 8;
        lVar12 = 0;
        do {
          pvVar6 = mem_zalloc(3);
          *(void **)(&pcVar1->squares[lVar13]->feat + lVar14) = pvVar6;
          lVar12 = lVar12 + 1;
          lVar11 = (long)pcVar1->width;
          lVar14 = lVar14 + 0x28;
        } while (lVar12 < lVar11);
      }
      puVar7 = (uint16_t *)mem_zalloc(lVar11 * 2);
      (pcVar1->noise).grids[lVar13] = puVar7;
      puVar7 = (uint16_t *)mem_zalloc((long)pcVar1->width * 2);
      (pcVar1->scent).grids[lVar13] = puVar7;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pcVar1->height);
  }
  ppoVar8 = (object **)mem_zalloc(0x400);
  pcVar1->objects = ppoVar8;
  pcVar1->obj_max = 0x7f;
  pmVar9 = (monster *)mem_zalloc((ulong)z_info->level_monster_max * 0x1a0);
  pcVar1->monsters = pmVar9;
  pcVar1->mon_max = 1;
  pcVar1->mon_current = L'\xffffffff';
  ppmVar10 = (monster_group **)mem_zalloc((ulong)z_info->level_monster_max << 3);
  pcVar1->monster_groups = ppmVar10;
  pcVar1->turn = turn;
  return pcVar1;
}

Assistant:

struct chunk *cave_new(int height, int width) {
	int y, x;

	struct chunk *c = mem_zalloc(sizeof *c);
	c->height = height;
	c->width = width;
	c->feat_count = mem_zalloc((FEAT_MAX + 1) * sizeof(int));

	c->squares = mem_zalloc(c->height * sizeof(struct square*));
	c->noise.grids = mem_zalloc(c->height * sizeof(uint16_t*));
	c->scent.grids = mem_zalloc(c->height * sizeof(uint16_t*));
	for (y = 0; y < c->height; y++) {
		c->squares[y] = mem_zalloc(c->width * sizeof(struct square));
		for (x = 0; x < c->width; x++) {
			c->squares[y][x].info = mem_zalloc(SQUARE_SIZE * sizeof(bitflag));
		}
		c->noise.grids[y] = mem_zalloc(c->width * sizeof(uint16_t));
		c->scent.grids[y] = mem_zalloc(c->width * sizeof(uint16_t));
	}

	c->objects = mem_zalloc(OBJECT_LIST_SIZE * sizeof(struct object*));
	c->obj_max = OBJECT_LIST_SIZE - 1;

	c->monsters = mem_zalloc(z_info->level_monster_max *sizeof(struct monster));
	c->mon_max = 1;
	c->mon_current = -1;

	c->monster_groups = mem_zalloc(z_info->level_monster_max *
								   sizeof(struct monster_group*));

	c->turn = turn;
	return c;
}